

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::ParseRoot(Parser *this,char *source,char **include_paths,char *source_filename)

{
  int *piVar1;
  int t;
  StructDef *this_00;
  Namespace *pNVar2;
  long lVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  Parser *pPVar6;
  int iVar7;
  EnumDef *pEVar8;
  long *plVar9;
  iterator __position;
  undefined8 *puVar10;
  _Base_ptr *pp_Var11;
  size_type *psVar12;
  long *plVar13;
  size_t max_components;
  _Base_ptr p_Var14;
  undefined8 uVar15;
  BaseType *pBVar16;
  char *in_R8;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  CheckedError err;
  undefined1 local_130 [32];
  Parser *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  pointer local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  _Base_ptr local_b8;
  _Base_ptr p_Stack_b0;
  int local_a4;
  string local_a0;
  undefined8 *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr p_Stack_60;
  _Base_ptr local_58;
  string local_50;
  
  DoParse(this,source,include_paths,source_filename,in_R8);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  local_110 = this;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00130d39;
  puVar10 = *(undefined8 **)(source + 0xd8);
  bVar17 = puVar10 == *(undefined8 **)(source + 0xe0);
  if (!bVar17) {
    local_58 = (_Base_ptr)(source + 0xa8);
    do {
      this_00 = (StructDef *)*puVar10;
      if (this_00->predecl == true) {
        if (source[0x3f9] == '\x01') {
          pNVar2 = (this_00->super_Definition).defined_namespace;
          max_components =
               (long)(pNVar2->components).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pNVar2->components).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
          local_80 = puVar10;
          if (max_components == 0xffffffffffffffff) {
            bVar19 = true;
            pEVar8 = (EnumDef *)0x0;
          }
          else {
            do {
              Namespace::GetFullyQualifiedName
                        ((string *)local_130,(this_00->super_Definition).defined_namespace,
                         (string *)this_00,max_components);
              pEVar8 = LookupEnum((Parser *)source,(string *)local_130);
              if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
                operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
              }
              bVar19 = pEVar8 == (EnumDef *)0x0;
              bVar18 = max_components != 0;
              max_components = max_components - 1;
            } while ((bVar18) && (pEVar8 == (EnumDef *)0x0));
          }
          p_Var14 = local_58;
          iVar7 = 0;
          if (!bVar19) {
            iVar7 = (this_00->super_Definition).refcount;
            for (plVar9 = *(long **)(source + 0xd8); plVar9 != *(long **)(source + 0xe0);
                plVar9 = plVar9 + 1) {
              lVar3 = *plVar9;
              for (plVar13 = *(long **)(lVar3 + 0xf8); plVar13 != *(long **)(lVar3 + 0x100);
                  plVar13 = plVar13 + 1) {
                lVar4 = *plVar13;
                if (*(StructDef **)(lVar4 + 0xd0) == this_00) {
                  *(undefined8 *)(lVar4 + 0xd0) = 0;
                  *(EnumDef **)(lVar4 + 0xd8) = pEVar8;
                  bVar18 = (*(int *)(lVar4 + 200) - 0xeU & 0xfffffffb) == 0;
                  pBVar16 = (BaseType *)(lVar4 + 0xcc);
                  if (!bVar18) {
                    pBVar16 = (BaseType *)(lVar4 + 200);
                  }
                  if (*(int *)(lVar4 + 200 + (ulong)bVar18 * 4) != 0xf) {
                    __assert_fail("bt == BASE_TYPE_STRUCT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                                  ,0xdd3,
                                  "CheckedError flatbuffers::Parser::ParseRoot(const char *, const char **, const char *)"
                                 );
                  }
                  *pBVar16 = (pEVar8->underlying_type).base_type;
                  piVar1 = &(this_00->super_Definition).refcount;
                  *piVar1 = *piVar1 + -1;
                  piVar1 = &(pEVar8->super_Definition).refcount;
                  *piVar1 = *piVar1 + 1;
                }
              }
            }
            t = (this_00->super_Definition).refcount;
            if (t == 0) {
              __position = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                                   *)local_58,(key_type *)this_00);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
              ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
                                  *)p_Var14,__position);
              puVar10 = local_80 + 1;
              if (puVar10 != *(undefined8 **)(source + 0xe0)) {
                memmove(local_80,puVar10,(long)*(undefined8 **)(source + 0xe0) - (long)puVar10);
              }
              *(long *)(source + 0xe0) = *(long *)(source + 0xe0) + -8;
              StructDef::~StructDef(this_00);
              operator_delete(this_00,0x148);
              iVar7 = 3;
            }
            else {
              local_a4 = iVar7;
              NumToString<int>(&local_50,t);
              plVar9 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_50,0,(char *)0x0,0x3624af);
              local_78 = (_Base_ptr)&local_68;
              p_Var14 = (_Base_ptr)(plVar9 + 2);
              if ((_Base_ptr)*plVar9 == p_Var14) {
                local_68 = *(_Base_ptr *)p_Var14;
                p_Stack_60 = (_Base_ptr)plVar9[3];
              }
              else {
                local_68 = *(_Base_ptr *)p_Var14;
                local_78 = (_Base_ptr)*plVar9;
              }
              local_70 = (_Base_ptr)plVar9[1];
              *plVar9 = (long)p_Var14;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_78);
              local_d8.field_2._M_allocated_capacity = (size_type)&local_b8;
              pp_Var11 = (_Base_ptr *)(plVar9 + 2);
              if ((_Base_ptr *)*plVar9 == pp_Var11) {
                local_b8 = *pp_Var11;
                p_Stack_b0 = (_Base_ptr)plVar9[3];
              }
              else {
                local_b8 = *pp_Var11;
                local_d8.field_2._M_allocated_capacity = (size_type)(_Base_ptr *)*plVar9;
              }
              local_d8.field_2._8_8_ = plVar9[1];
              *plVar9 = (long)pp_Var11;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              NumToString<int>(&local_a0,local_a4);
              p_Var14 = (_Base_ptr)0xf;
              if ((_Base_ptr *)local_d8.field_2._M_allocated_capacity != &local_b8) {
                p_Var14 = local_b8;
              }
              if (p_Var14 < (_Base_ptr)(local_a0._M_string_length + local_d8.field_2._8_8_)) {
                uVar15 = (_Base_ptr)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  uVar15 = local_a0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar15 < (_Base_ptr)(local_a0._M_string_length + local_d8.field_2._8_8_))
                goto LAB_00130907;
                plVar9 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_a0,0,(char *)0x0,
                                            local_d8.field_2._M_allocated_capacity);
              }
              else {
LAB_00130907:
                plVar9 = (long *)std::__cxx11::string::_M_append
                                           (local_d8.field_2._M_local_buf,
                                            (ulong)local_a0._M_dataplus._M_p);
              }
              local_e8 = &local_d8;
              pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar9 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9 ==
                  pbVar5) {
                local_d8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                local_d8._M_string_length = plVar9[3];
              }
              else {
                local_d8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           *plVar9;
              }
              local_e0 = (pointer)plVar9[1];
              *plVar9 = (long)pbVar5;
              plVar9[1] = 0;
              *(undefined1 *)&(pbVar5->_M_dataplus)._M_p = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_108.field_2._M_allocated_capacity = *psVar12;
                local_108.field_2._8_8_ = plVar9[3];
              }
              else {
                local_108.field_2._M_allocated_capacity = *psVar12;
                local_108._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_108._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_108,
                                          (ulong)(pEVar8->super_Definition).name._M_dataplus._M_p);
              local_130._0_8_ = local_130 + 0x10;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((size_type *)*plVar9 == psVar12) {
                local_130._16_8_ = *psVar12;
                local_130._24_8_ = plVar9[3];
              }
              else {
                local_130._16_8_ = *psVar12;
                local_130._0_8_ = (size_type *)*plVar9;
              }
              local_130._8_8_ = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              Error(local_110,(string *)source);
              if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
                operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
              if (local_e8 != &local_d8) {
                operator_delete(local_e8,(ulong)(local_d8._M_dataplus._M_p + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,
                                (ulong)(local_a0.field_2._M_allocated_capacity + 1));
              }
              if ((_Base_ptr *)local_d8.field_2._M_allocated_capacity != &local_b8) {
                operator_delete((void *)local_d8.field_2._M_allocated_capacity,
                                (ulong)((long)&local_b8->_M_color + 1));
              }
              if (local_78 != (_Base_ptr)&local_68) {
                operator_delete(local_78,(ulong)((long)&local_68->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              iVar7 = 1;
            }
          }
          puVar10 = local_80;
          if (!bVar19) goto LAB_00130bbd;
        }
        std::operator+((string *)local_130,"type referenced but not defined (check namespace): ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
        ;
        pbVar5 = (this_00->original_location)._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
        if (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::operator+(&local_108,", originally at: ",pbVar5);
          std::__cxx11::string::_M_append((char *)local_130,(ulong)local_108._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
        }
        Error(local_110,(string *)source);
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
        }
        iVar7 = 1;
      }
      else {
        puVar10 = puVar10 + 1;
        iVar7 = 0;
      }
LAB_00130bbd:
      if ((iVar7 != 3) && (iVar7 != 0)) {
        if (!bVar17) goto LAB_00130d39;
        break;
      }
      bVar17 = puVar10 == *(undefined8 **)(source + 0xe0);
    } while (!bVar17);
  }
  plVar9 = *(long **)(source + 0x120);
  bVar17 = plVar9 == *(long **)(source + 0x128);
  if (!bVar17) {
    do {
      lVar3 = *plVar9;
      if (*(char *)(lVar3 + 200) == '\x01') {
        puVar10 = *(undefined8 **)(lVar3 + 0x120);
        bVar19 = puVar10 == *(undefined8 **)(lVar3 + 0x128);
        if (!bVar19) {
          do {
            if ((*(ulong *)(source + 0x680) & 0xfffffffffff47c34) != 0 ||
                *(ulong *)(source + 0x680) == 0) {
              pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar10
              ;
              iVar7 = *(int *)((long)&pbVar5[1].field_2 + 8);
              if (iVar7 == 0xf) {
                if (pbVar5[2]._M_dataplus._M_p[0x110] != '\0') goto LAB_00130c86;
              }
              else if (iVar7 == 0xd) {
LAB_00130c86:
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_130,
                               "only tables can be union elements in the generated language: ",
                               pbVar5);
                Error(local_110,(string *)source);
                if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
                  operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
                }
                if (!bVar19) {
                  if (!bVar17) goto LAB_00130d39;
                  goto LAB_00130cdc;
                }
                break;
              }
            }
            puVar10 = puVar10 + 1;
            bVar19 = puVar10 == *(undefined8 **)(lVar3 + 0x128);
          } while (!bVar19);
        }
      }
      plVar9 = plVar9 + 1;
      bVar17 = plVar9 == *(long **)(source + 0x128);
    } while (!bVar17);
  }
LAB_00130cdc:
  CheckPrivateLeak((Parser *)local_130);
  pPVar6 = local_110;
  local_130[1] = 1;
  if (local_130[0] == '\x01') {
    *(undefined1 *)&(local_110->super_ParserState).prev_cursor_ = 1;
    *(undefined1 *)((long)&(local_110->super_ParserState).prev_cursor_ + 1) = 0;
    local_130._0_2_ = 0x101;
  }
  else {
    if (*(int *)(source + 0x1c) == 0x7b) {
      DoParseJson(local_110);
      *(undefined1 *)((long)&(pPVar6->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(pPVar6->super_ParserState).prev_cursor_ != '\0') goto LAB_00130d32;
    }
    *(undefined2 *)&(local_110->super_ParserState).prev_cursor_ = 0;
  }
LAB_00130d32:
  if (local_130[1] == '\0') {
    __assert_fail("has_been_checked_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x3a4,"flatbuffers::CheckedError::~CheckedError()");
  }
LAB_00130d39:
  return SUB82(local_110,0);
}

Assistant:

CheckedError Parser::ParseRoot(const char *source, const char **include_paths,
                               const char *source_filename) {
  ECHECK(DoParse(source, include_paths, source_filename, nullptr));

  // Check that all types were defined.
  for (auto it = structs_.vec.begin(); it != structs_.vec.end();) {
    auto &struct_def = **it;
    if (struct_def.predecl) {
      if (opts.proto_mode) {
        // Protos allow enums to be used before declaration, so check if that
        // is the case here.
        EnumDef *enum_def = nullptr;
        for (size_t components =
                 struct_def.defined_namespace->components.size() + 1;
             components && !enum_def; components--) {
          auto qualified_name =
              struct_def.defined_namespace->GetFullyQualifiedName(
                  struct_def.name, components - 1);
          enum_def = LookupEnum(qualified_name);
        }
        if (enum_def) {
          // This is pretty slow, but a simple solution for now.
          auto initial_count = struct_def.refcount;
          for (auto struct_it = structs_.vec.begin();
               struct_it != structs_.vec.end(); ++struct_it) {
            auto &sd = **struct_it;
            for (auto field_it = sd.fields.vec.begin();
                 field_it != sd.fields.vec.end(); ++field_it) {
              auto &field = **field_it;
              if (field.value.type.struct_def == &struct_def) {
                field.value.type.struct_def = nullptr;
                field.value.type.enum_def = enum_def;
                auto &bt = IsVector(field.value.type)
                               ? field.value.type.element
                               : field.value.type.base_type;
                FLATBUFFERS_ASSERT(bt == BASE_TYPE_STRUCT);
                bt = enum_def->underlying_type.base_type;
                struct_def.refcount--;
                enum_def->refcount++;
              }
            }
          }
          if (struct_def.refcount)
            return Error("internal: " + NumToString(struct_def.refcount) + "/" +
                         NumToString(initial_count) +
                         " use(s) of pre-declaration enum not accounted for: " +
                         enum_def->name);
          structs_.dict.erase(structs_.dict.find(struct_def.name));
          it = structs_.vec.erase(it);
          delete &struct_def;
          continue;  // Skip error.
        }
      }
      auto err = "type referenced but not defined (check namespace): " +
                 struct_def.name;
      if (struct_def.original_location)
        err += ", originally at: " + *struct_def.original_location;
      return Error(err);
    }
    ++it;
  }

  // This check has to happen here and not earlier, because only now do we
  // know for sure what the type of these are.
  for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
    auto &enum_def = **it;
    if (enum_def.is_union) {
      for (auto val_it = enum_def.Vals().begin();
           val_it != enum_def.Vals().end(); ++val_it) {
        auto &val = **val_it;

        if (!(opts.lang_to_generate != 0 && SupportsAdvancedUnionFeatures()) &&
            (IsStruct(val.union_type) || IsString(val.union_type)))

          return Error(
              "only tables can be union elements in the generated language: " +
              val.name);
      }
    }
  }

  auto err = CheckPrivateLeak();
  if (err.Check()) return err;

  // Parse JSON object only if the scheme has been parsed.
  if (token_ == '{') { ECHECK(DoParseJson()); }
  return NoError();
}